

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O1

void mserialize::CustomDeserializer<Person,_void>::deserialize(Person *p,InputStream *istream)

{
  int iVar1;
  runtime_error *this;
  string foobar;
  uint32_t size;
  char buffer [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 local_30;
  undefined2 local_2c;
  
  local_2c = 0;
  local_30 = 0;
  std::istream::read((char *)istream->stream,(long)&local_30);
  local_70.field_2._M_allocated_capacity._0_4_ = local_30;
  local_70.field_2._M_allocated_capacity._4_2_ = local_2c;
  local_70._M_string_length = 6;
  local_70.field_2._M_local_buf[6] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  iVar1 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar1 == 0) {
    std::istream::read((char *)istream->stream,(long)p);
    std::istream::read((char *)istream->stream,(long)&local_50);
    detail::
    BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::deserialize_elems<InputStream>(&p->name,local_50._M_dataplus._M_p._0_4_,istream);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               CONCAT16(local_70.field_2._M_local_buf[6],
                                        CONCAT24(local_70.field_2._M_allocated_capacity._4_2_,
                                                 local_70.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Invalid magic: ",&local_70);
  std::runtime_error::runtime_error(this,(string *)&local_50);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void deserialize(Person& p, InputStream& istream)
  {
    char buffer[6] = {0};
    istream.read(buffer, 6);
    const std::string foobar(buffer, 6);
    if (foobar != "foobar")
    {
      throw std::runtime_error("Invalid magic: " + foobar);
    }

    mserialize::deserialize(p.age, istream);
    mserialize::deserialize(p.name, istream);
  }